

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O3

void __thiscall GraphEditor::apply_all(GraphEditor *this)

{
  int32_t d;
  sgNodeID_t *psVar1;
  WorkSpace *pWVar2;
  undefined8 uVar3;
  sgNodeID_t sVar4;
  pointer __pos;
  long lVar5;
  pointer pLVar6;
  long n;
  vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_> *this_00;
  GraphEditorLinkDeletion *op;
  pointer pGVar7;
  pointer pGVar8;
  ulong uVar9;
  pointer pGVar10;
  undefined1 local_e0 [40];
  ulong local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  int32_t local_98;
  int32_t local_94;
  vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_> *local_90;
  string local_88;
  string local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  __pos = (this->node_deletion_queue).
          super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>.
          _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->node_deletion_queue;
  if (this->next_op != 0) {
    pGVar10 = (this->path_detachment_queue).
              super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar7 = (this->link_deletion_queue).
             super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar8 = (this->node_expansion_queue).
             super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    local_90 = &this->node_deletion_queue;
    do {
      if ((__pos != (this->node_deletion_queue).
                    super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>
                    ._M_impl.super__Vector_impl_data._M_finish) &&
         ((__pos->super_GraphEditorOperation).index == uVar9)) {
        lVar5 = *(__pos->super_GraphEditorOperation).input_nodes.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        n = -lVar5;
        if (0 < lVar5) {
          n = lVar5;
        }
        SequenceDistanceGraph::remove_node(&this->ws->sdg,n);
        __pos = __pos + 1;
      }
      if ((pGVar7 != (this->link_deletion_queue).
                     super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar7->super_GraphEditorOperation).index == uVar9)) {
        psVar1 = (pGVar7->super_GraphEditorOperation).input_ends.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        DistanceGraph::remove_link((DistanceGraph *)this->ws,*psVar1,psVar1[1]);
        pGVar7 = pGVar7 + 1;
      }
      if ((pGVar8 != (this->node_expansion_queue).
                     super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar8->super_GraphEditorOperation).index == uVar9)) {
        local_b8 = uVar9;
        local_b0 = pGVar7;
        local_a8 = pGVar10;
        local_a0 = __pos;
        if (8 < (ulong)((long)(pGVar8->super_GraphEditorOperation).input_ends.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pGVar8->super_GraphEditorOperation).input_ends.
                             super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          lVar5 = 0;
          uVar9 = 0;
          do {
            pWVar2 = this->ws;
            SequenceDistanceGraph::get_node_sequence_abi_cxx11_
                      (&local_68,&pWVar2->sdg,
                       *(pGVar8->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_68,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            DistanceGraph::get_link
                      ((Link *)local_e0,(DistanceGraph *)this->ws,
                       *(sgNodeID_t *)
                        ((long)(pGVar8->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5),
                       *(pGVar8->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            DistanceGraph::add_link
                      ((DistanceGraph *)this->ws,
                       *(sgNodeID_t *)
                        ((long)(pGVar8->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5),sVar4,local_e0._16_4_,
                       (Support)ZEXT816(0));
            DistanceGraph::get_link
                      ((Link *)local_e0,(DistanceGraph *)this->ws,
                       -*(pGVar8->super_GraphEditorOperation).input_nodes.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       *(sgNodeID_t *)
                        ((long)(pGVar8->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5 + 8));
            DistanceGraph::add_link
                      ((DistanceGraph *)this->ws,-sVar4,
                       *(sgNodeID_t *)
                        ((long)(pGVar8->super_GraphEditorOperation).input_ends.
                               super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5 + 8),local_e0._16_4_,
                       (Support)ZEXT816(0));
            uVar9 = uVar9 + 1;
            lVar5 = lVar5 + 0x10;
          } while (uVar9 < (ulong)((long)(pGVar8->super_GraphEditorOperation).input_ends.
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                   (long)(pGVar8->super_GraphEditorOperation).input_ends.
                                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                         super__Vector_impl_data._M_start >> 3) >> 1);
        }
        SequenceDistanceGraph::remove_node
                  (&this->ws->sdg,
                   *(pGVar8->super_GraphEditorOperation).input_nodes.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start);
        pGVar8 = pGVar8 + 1;
        uVar9 = local_b8;
        __pos = local_a0;
        pGVar7 = local_b0;
        pGVar10 = local_a8;
      }
      if ((pGVar10 !=
           (this->path_detachment_queue).
           super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((pGVar10->super_GraphEditorOperation).index == uVar9)) {
        if ((pGVar10->super_GraphEditorOperation).input_nodes.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
            == (pGVar10->super_GraphEditorOperation).input_nodes.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
          if (pGVar10->full_detach == true) {
            local_b8 = uVar9;
            local_b0 = pGVar7;
            DistanceGraph::get_fw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                       -*(pGVar10->super_GraphEditorOperation).input_ends.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
            uVar3 = local_e0._8_8_;
            for (pLVar6 = (pointer)local_e0._0_8_; pLVar6 != (pointer)uVar3; pLVar6 = pLVar6 + 1) {
              if (pLVar6->dest !=
                  (pGVar10->super_GraphEditorOperation).input_ends.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start[1]) {
                DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar6->source,pLVar6->dest);
              }
            }
            if ((pointer)local_e0._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_e0._0_8_,
                              CONCAT44(local_e0._20_4_,local_e0._16_4_) - local_e0._0_8_);
            }
            DistanceGraph::get_bw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                       (pGVar10->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
            uVar3 = local_e0._8_8_;
            for (pLVar6 = (pointer)local_e0._0_8_; pLVar6 != (pointer)uVar3; pLVar6 = pLVar6 + 1) {
              if (pLVar6->dest !=
                  *(pGVar10->super_GraphEditorOperation).input_ends.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start) {
                DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar6->source,pLVar6->dest);
              }
            }
            uVar9 = local_b8;
            pGVar7 = local_b0;
            if ((pointer)local_e0._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_e0._0_8_,
                              CONCAT44(local_e0._20_4_,local_e0._16_4_) - local_e0._0_8_);
              uVar9 = local_b8;
              pGVar7 = local_b0;
            }
          }
        }
        else {
          pWVar2 = this->ws;
          local_b8 = uVar9;
          local_b0 = pGVar7;
          local_a0 = __pos;
          std::vector<long,_std::allocator<long>_>::vector
                    (&local_48,&(pGVar10->super_GraphEditorOperation).input_nodes);
          std::vector<long,_std::allocator<long>_>::vector
                    ((vector<long,_std::allocator<long>_> *)local_e0,&local_48);
          local_e0._24_8_ = pWVar2;
          SequenceDistanceGraphPath::sequence_abi_cxx11_
                    (&local_88,(SequenceDistanceGraphPath *)local_e0);
          sVar4 = SequenceDistanceGraph::add_node(&pWVar2->sdg,&local_88,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_e0._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_e0._0_8_,
                            CONCAT44(local_e0._20_4_,local_e0._16_4_) - local_e0._0_8_);
          }
          if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          DistanceGraph::get_link
                    ((Link *)local_e0,(DistanceGraph *)this->ws,
                     *(pGVar10->super_GraphEditorOperation).input_ends.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                     *(pGVar10->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
          d = local_e0._16_4_;
          DistanceGraph::get_link
                    ((Link *)local_e0,(DistanceGraph *)this->ws,
                     -(pGVar10->super_GraphEditorOperation).input_nodes.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1],
                     (pGVar10->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1]);
          local_94 = local_e0._16_4_;
          if (pGVar10->full_detach == true) {
            local_98 = d;
            local_a8 = pGVar10;
            DistanceGraph::get_fw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                       -*(pGVar10->super_GraphEditorOperation).input_ends.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
            uVar3 = local_e0._8_8_;
            for (pLVar6 = (pointer)local_e0._0_8_; pLVar6 != (pointer)uVar3; pLVar6 = pLVar6 + 1) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar6->source,pLVar6->dest);
            }
            if ((pointer)local_e0._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_e0._0_8_,
                              CONCAT44(local_e0._20_4_,local_e0._16_4_) - local_e0._0_8_);
            }
            DistanceGraph::get_bw_links
                      ((vector<Link,_std::allocator<Link>_> *)local_e0,(DistanceGraph *)this->ws,
                       (local_a8->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
            uVar3 = local_e0._8_8_;
            for (pLVar6 = (pointer)local_e0._0_8_; pLVar6 != (pointer)uVar3; pLVar6 = pLVar6 + 1) {
              DistanceGraph::remove_link((DistanceGraph *)this->ws,pLVar6->source,pLVar6->dest);
            }
            pGVar10 = local_a8;
            d = local_98;
            if ((pointer)local_e0._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_e0._0_8_,
                              CONCAT44(local_e0._20_4_,local_e0._16_4_) - local_e0._0_8_);
              pGVar10 = local_a8;
              d = local_98;
            }
          }
          else {
            DistanceGraph::remove_link
                      ((DistanceGraph *)this->ws,
                       *(pGVar10->super_GraphEditorOperation).input_ends.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                       *(pGVar10->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
            DistanceGraph::remove_link
                      ((DistanceGraph *)this->ws,
                       -(pGVar10->super_GraphEditorOperation).input_nodes.
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1],
                       (pGVar10->super_GraphEditorOperation).input_ends.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
          }
          DistanceGraph::add_link
                    ((DistanceGraph *)this->ws,
                     *(pGVar10->super_GraphEditorOperation).input_ends.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar4,d,(Support)ZEXT816(0));
          DistanceGraph::add_link
                    ((DistanceGraph *)this->ws,-sVar4,
                     (pGVar10->super_GraphEditorOperation).input_ends.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start[1],local_94,(Support)ZEXT816(0));
          uVar9 = local_b8;
          __pos = local_a0;
          pGVar7 = local_b0;
        }
        pGVar10 = pGVar10 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->next_op);
    __pos = (local_90->
            super__Vector_base<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>).
            _M_impl.super__Vector_impl_data._M_start;
    this_00 = local_90;
  }
  std::vector<GraphEditorNodeDeletion,_std::allocator<GraphEditorNodeDeletion>_>::_M_erase_at_end
            (this_00,__pos);
  std::vector<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>::_M_erase_at_end
            (&this->link_deletion_queue,
             (this->link_deletion_queue).
             super__Vector_base<GraphEditorLinkDeletion,_std::allocator<GraphEditorLinkDeletion>_>.
             _M_impl.super__Vector_impl_data._M_start);
  std::vector<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>::_M_erase_at_end
            (&this->node_expansion_queue,
             (this->node_expansion_queue).
             super__Vector_base<GraphEditorNodeExpansion,_std::allocator<GraphEditorNodeExpansion>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::vector<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>::
  _M_erase_at_end(&this->path_detachment_queue,
                  (this->path_detachment_queue).
                  super__Vector_base<GraphEditorPathDetachment,_std::allocator<GraphEditorPathDetachment>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  this->next_op = 0;
  return;
}

Assistant:

void GraphEditor::apply_all() {
    auto next_node_deletion=node_deletion_queue.begin();
    auto next_link_deletion=link_deletion_queue.begin();
    auto next_expansion=node_expansion_queue.begin();
    auto next_detachment=path_detachment_queue.begin();
    for (uint64_t i=0;i<next_op;++i) {
//    sdglib::OutputLog()<<"Applying all graph edits: "<<node_deletion_queue.size()<<" node deletions, "
//            <<link_deletion_queue.size()<<" link deletions, "
//            <<node_expansion_queue.size()<<" node expansions, "
//            <<path_detachment_queue.size()<<" path detachments"<<std::endl;
        if (next_node_deletion!=node_deletion_queue.end() and next_node_deletion->index==i) {
            auto &op=*next_node_deletion;
            ws.sdg.remove_node(llabs(op.input_nodes[0]));
            ++next_node_deletion;
        }
        if (next_link_deletion!=link_deletion_queue.end() and next_link_deletion->index==i) {
            auto &op=*next_link_deletion;
            ws.sdg.remove_link(op.input_ends[0],op.input_ends[1]);
            ++next_link_deletion;
        }
        if (next_expansion!=node_expansion_queue.end() and next_expansion->index==i) {
            auto &op=*next_expansion;
            for (auto li = 0; li < op.input_ends.size() / 2; ++li) {
                //create a copy of the node;
                auto new_node = ws.sdg.add_node(ws.sdg.get_node_sequence(op.input_nodes[0]));
                //connect to the sides
                auto source_dist = ws.sdg.get_link(op.input_ends[2 * li], op.input_nodes[0]).dist;
                ws.sdg.add_link(op.input_ends[2 * li], new_node, source_dist);
                auto dest_dist = ws.sdg.get_link(-op.input_nodes[0], op.input_ends[2 * li + 1]).dist;
                ws.sdg.add_link(-new_node, op.input_ends[2 * li + 1], dest_dist);
            }
            ws.sdg.remove_node(op.input_nodes[0]);
            ++next_expansion;
        }
        if (next_detachment!=path_detachment_queue.end() and next_detachment->index==i) {
            auto &op=*next_detachment;
            //special case: path with just ends
            if (op.input_nodes.empty()) {
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0]))
                        if (l.dest != op.input_ends[1]) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1]))
                        if (l.dest != op.input_ends[0]) ws.sdg.remove_link(l.source, l.dest);

                }
            } else {
                //Create a unitig with the internal path sequence
                auto new_node = ws.sdg.add_node(SequenceDistanceGraphPath(ws.sdg, op.input_nodes).sequence());
                auto first_dist = ws.sdg.get_link(op.input_ends[0], op.input_nodes.front()).dist;
                auto last_dist = ws.sdg.get_link(-op.input_nodes.back(), op.input_ends[1]).dist;
                if ( op.full_detach ) {
                    for (auto l:ws.sdg.get_fw_links(-op.input_ends[0])) ws.sdg.remove_link(l.source, l.dest);
                    for (auto l:ws.sdg.get_bw_links(op.input_ends[1])) ws.sdg.remove_link(l.source, l.dest);
                }
                else {
                    ws.sdg.remove_link(op.input_ends[0], op.input_nodes.front());
                    ws.sdg.remove_link(-op.input_nodes.back(), op.input_ends[1]);
                }
                ws.sdg.add_link(op.input_ends[0], new_node, first_dist);
                ws.sdg.add_link(-new_node, op.input_ends[1], last_dist);
            }
            ++next_detachment;
        }

    }
    node_deletion_queue.clear();
    link_deletion_queue.clear();
    node_expansion_queue.clear();
    path_detachment_queue.clear();
    next_op=0;
}